

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath * __thiscall testing::internal::FilePath::RemoveExtension(FilePath *this,char *extension)

{
  bool bVar1;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string dot_extension;
  FilePath *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *str;
  string local_90 [55];
  undefined1 local_59 [33];
  string local_38 [56];
  
  str = (string *)local_59;
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_59 + 1),".",(allocator *)str);
  std::operator+(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  bVar1 = String::EndsWithCaseInsensitive(str,in_RSI);
  if (bVar1) {
    std::__cxx11::string::length();
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_90,(ulong)in_RSI);
    FilePath((FilePath *)this_00,in_RDI);
    std::__cxx11::string::~string(local_90);
  }
  else {
    FilePath((FilePath *)CONCAT17(bVar1,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38);
  }
  std::__cxx11::string::~string(local_38);
  return (FilePath *)this_00;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  const std::string dot_extension = std::string(".") + extension;
  if (String::EndsWithCaseInsensitive(pathname_, dot_extension)) {
    return FilePath(pathname_.substr(
        0, pathname_.length() - dot_extension.length()));
  }
  return *this;
}